

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O3

string * __thiscall
str::join<std::set<Token,std::less<Token>,std::allocator<Token>>>
          (string *__return_storage_ptr__,str *this,string_view delimiter,
          set<Token,_std::less<Token>,_std::allocator<Token>_> *container)

{
  _Rb_tree_node_base *p_Var1;
  ostream *o;
  _Rb_tree_node_base *p_Var2;
  _Self __tmp;
  _Self __tmp_1;
  _Rb_tree_node_base *p_Var3;
  ostringstream local_1b8 [8];
  ostringstream stream;
  ios_base local_148 [264];
  char *local_40;
  string *local_38;
  
  local_40 = (char *)delimiter._M_len;
  p_Var2 = *(_Rb_tree_node_base **)(delimiter._M_str + 0x18);
  p_Var3 = (_Rb_tree_node_base *)(delimiter._M_str + 8);
  if (p_Var2 == p_Var3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    local_38 = __return_storage_ptr__;
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    operator<<((ostream *)local_1b8,(Token *)(p_Var2 + 1));
    while (__return_storage_ptr__ = local_38, p_Var1 != p_Var3) {
      o = std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,local_40,(long)this);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
      operator<<((ostream *)o,(Token *)(p_Var1 + 1));
      p_Var1 = p_Var2;
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
    std::ios_base::~ios_base(local_148);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string join(std::string_view delimiter, const Container& container) {
        if (std::begin(container) == std::end(container)) {
            return "";
        }

        auto it = std::begin(container);
        std::ostringstream stream;
        stream << *it++;
        while (it != std::end(container)) {
            stream << delimiter << *it++;
        }

        return stream.str();
    }